

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayKernel.cc
# Opt level: O0

void __thiscall OpenMesh::ArrayKernel::garbage_collection(ArrayKernel *this,bool _v,bool _e,bool _f)

{
  pointer *this_00;
  pointer *this_01;
  undefined1 local_60 [8];
  vector<OpenMesh::FaceHandle_*,_std::allocator<OpenMesh::FaceHandle_*>_> empty_fh;
  vector<OpenMesh::HalfedgeHandle_*,_std::allocator<OpenMesh::HalfedgeHandle_*>_> empty_hh;
  vector<OpenMesh::VertexHandle_*,_std::allocator<OpenMesh::VertexHandle_*>_> empty_vh;
  bool _f_local;
  bool _e_local;
  bool _v_local;
  ArrayKernel *this_local;
  
  this_00 = &empty_hh.
             super__Vector_base<OpenMesh::HalfedgeHandle_*,_std::allocator<OpenMesh::HalfedgeHandle_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<OpenMesh::VertexHandle_*,_std::allocator<OpenMesh::VertexHandle_*>_>::vector
            ((vector<OpenMesh::VertexHandle_*,_std::allocator<OpenMesh::VertexHandle_*>_> *)this_00)
  ;
  this_01 = &empty_fh.
             super__Vector_base<OpenMesh::FaceHandle_*,_std::allocator<OpenMesh::FaceHandle_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<OpenMesh::HalfedgeHandle_*,_std::allocator<OpenMesh::HalfedgeHandle_*>_>::vector
            ((vector<OpenMesh::HalfedgeHandle_*,_std::allocator<OpenMesh::HalfedgeHandle_*>_> *)
             this_01);
  std::vector<OpenMesh::FaceHandle_*,_std::allocator<OpenMesh::FaceHandle_*>_>::vector
            ((vector<OpenMesh::FaceHandle_*,_std::allocator<OpenMesh::FaceHandle_*>_> *)local_60);
  garbage_collection<std::vector<OpenMesh::VertexHandle*,std::allocator<OpenMesh::VertexHandle*>>,std::vector<OpenMesh::HalfedgeHandle*,std::allocator<OpenMesh::HalfedgeHandle*>>,std::vector<OpenMesh::FaceHandle*,std::allocator<OpenMesh::FaceHandle*>>>
            (this,(vector<OpenMesh::VertexHandle_*,_std::allocator<OpenMesh::VertexHandle_*>_> *)
                  this_00,
             (vector<OpenMesh::HalfedgeHandle_*,_std::allocator<OpenMesh::HalfedgeHandle_*>_> *)
             this_01,(vector<OpenMesh::FaceHandle_*,_std::allocator<OpenMesh::FaceHandle_*>_> *)
                     local_60,_v,_e,_f);
  std::vector<OpenMesh::FaceHandle_*,_std::allocator<OpenMesh::FaceHandle_*>_>::~vector
            ((vector<OpenMesh::FaceHandle_*,_std::allocator<OpenMesh::FaceHandle_*>_> *)local_60);
  std::vector<OpenMesh::HalfedgeHandle_*,_std::allocator<OpenMesh::HalfedgeHandle_*>_>::~vector
            ((vector<OpenMesh::HalfedgeHandle_*,_std::allocator<OpenMesh::HalfedgeHandle_*>_> *)
             &empty_fh.
              super__Vector_base<OpenMesh::FaceHandle_*,_std::allocator<OpenMesh::FaceHandle_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<OpenMesh::VertexHandle_*,_std::allocator<OpenMesh::VertexHandle_*>_>::~vector
            ((vector<OpenMesh::VertexHandle_*,_std::allocator<OpenMesh::VertexHandle_*>_> *)
             &empty_hh.
              super__Vector_base<OpenMesh::HalfedgeHandle_*,_std::allocator<OpenMesh::HalfedgeHandle_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void ArrayKernel::garbage_collection(bool _v, bool _e, bool _f)
{
  std::vector<VertexHandle*> empty_vh;
  std::vector<HalfedgeHandle*> empty_hh;
  std::vector<FaceHandle*> empty_fh;
  garbage_collection( empty_vh,empty_hh,empty_fh,_v, _e, _f);
}